

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int acttab_insert(acttab *p,int makeItSafe)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  lookahead_action *plVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  lookahead_action *plVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  
  if (p->nLookahead < 1) {
    __assert_fail("p->nLookahead>0",
                  "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/lemon.c",0x2aa,
                  "int acttab_insert(acttab *, int)");
  }
  iVar3 = p->nAction + p->nsymbol + 1;
  uVar4 = p->nActionAlloc;
  if ((int)uVar4 <= iVar3) {
    iVar3 = iVar3 + uVar4 + 0x14;
    p->nActionAlloc = iVar3;
    plVar9 = p->aAction;
    plVar5 = (lookahead_action *)realloc(plVar9,(long)iVar3 << 3);
    p->aAction = plVar5;
    if (plVar5 == (lookahead_action *)0x0) {
      acttab_insert_cold_1();
      uVar4 = plVar9->lookahead;
      if (0 < (int)uVar4) {
        do {
          if (-1 < *(int *)((long)plVar9[1] + -8 + (ulong)uVar4 * 8)) {
            return uVar4;
          }
          bVar1 = 1 < (int)uVar4;
          uVar4 = uVar4 - 1;
        } while (bVar1);
        uVar4 = 0;
      }
      return uVar4;
    }
    if ((int)uVar4 < p->nActionAlloc) {
      memset(plVar5 + (int)uVar4,0xff,(ulong)(p->nActionAlloc + ~uVar4) * 8 + 8);
    }
  }
  if (makeItSafe == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = p->mnLookahead;
  }
  uVar4 = p->nAction;
  bVar1 = iVar3 < (int)uVar4;
  if (iVar3 < (int)uVar4) {
    plVar9 = p->aAction;
    iVar8 = p->mnLookahead;
    iVar10 = iVar8 - uVar4;
    uVar11 = (long)(int)uVar4;
    do {
      iVar10 = iVar10 + 1;
      uVar6 = uVar11 - 1;
      if ((plVar9[uVar11 - 1].lookahead == iVar8) && (plVar9[uVar6].action == p->mnAction)) {
        uVar11 = (ulong)p->nLookahead;
        bVar2 = 0 < (long)uVar11;
        if (0 < (long)uVar11) {
          plVar5 = p->aLookahead;
          iVar12 = plVar5->lookahead;
          uVar13 = (iVar12 - iVar8) + (int)uVar6;
          if ((int)uVar13 < (int)uVar4 && -1 < (int)uVar13) {
            uVar15 = 1;
            while ((iVar12 == plVar9[uVar13].lookahead &&
                   (plVar5[uVar15 - 1].action == plVar9[uVar13].action))) {
              if (uVar11 == uVar15) goto LAB_00102c87;
              bVar2 = uVar15 < uVar11;
              iVar12 = plVar5[uVar15].lookahead;
              uVar13 = (iVar12 - iVar8) + (int)uVar6;
              if (((int)uVar13 < 0) || (uVar15 = uVar15 + 1, (int)uVar4 <= (int)uVar13)) break;
            }
          }
          if (bVar2) goto LAB_00102cc6;
        }
LAB_00102c87:
        if ((int)uVar4 < 1) {
          iVar12 = 0;
        }
        else {
          uVar11 = 0;
          iVar12 = 0;
          do {
            iVar12 = iVar12 + (uint)(iVar10 + (int)uVar11 == plVar9[uVar11].lookahead &&
                                    -1 < plVar9[uVar11].lookahead);
            uVar11 = uVar11 + 1;
          } while (uVar4 != uVar11);
        }
        if (iVar12 == p->nLookahead) {
          if (bVar1) goto LAB_00102d9f;
          break;
        }
      }
LAB_00102cc6:
      bVar1 = (long)iVar3 < (long)uVar6;
      uVar11 = uVar6;
    } while ((long)iVar3 < (long)uVar6);
  }
  if (makeItSafe == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (ulong)(uint)p->mnLookahead;
  }
  uVar11 = (long)p->nActionAlloc - (long)p->mxLookahead;
  iVar3 = (int)uVar6;
  if (iVar3 < (int)uVar11) {
    plVar9 = p->aAction;
    uVar6 = (ulong)iVar3;
    iVar3 = -iVar3;
    do {
      if (plVar9[uVar6].lookahead < 0) {
        uVar15 = (ulong)p->nLookahead;
        bVar1 = 0 < (long)uVar15;
        if (0 < (long)uVar15) {
          uVar13 = (p->aLookahead->lookahead - p->mnLookahead) + (int)uVar6;
          if (-1 < (int)uVar13) {
            uVar14 = 1;
            do {
              if (-1 < plVar9[uVar13].lookahead) break;
              if (uVar15 == uVar14) goto LAB_00102d53;
              bVar1 = uVar14 < uVar15;
              plVar5 = p->aLookahead + uVar14;
              uVar14 = uVar14 + 1;
              uVar13 = (plVar5->lookahead - p->mnLookahead) + (int)uVar6;
            } while (-1 < (int)uVar13);
          }
          if (bVar1) goto LAB_00102d80;
        }
LAB_00102d53:
        if ((int)uVar4 < 1) {
          uVar15 = 0;
        }
        else {
          uVar15 = 0;
          do {
            if (p->mnLookahead + iVar3 + (int)uVar15 == plVar9[uVar15].lookahead) goto LAB_00102d7b;
            uVar15 = uVar15 + 1;
          } while (uVar4 != uVar15);
          uVar15 = (ulong)uVar4;
        }
LAB_00102d7b:
        if ((uint)uVar15 == uVar4) {
          uVar6 = uVar6 & 0xffffffff;
          goto LAB_00102d9f;
        }
      }
LAB_00102d80:
      uVar6 = uVar6 + 1;
      iVar3 = iVar3 + -1;
    } while ((long)uVar6 < (long)uVar11);
    uVar6 = uVar11 & 0xffffffff;
  }
LAB_00102d9f:
  iVar3 = (int)uVar6;
  if (0 < p->nLookahead) {
    lVar7 = 0;
    do {
      iVar8 = (p->aLookahead[lVar7].lookahead - p->mnLookahead) + iVar3;
      p->aAction[iVar8] = p->aLookahead[lVar7];
      if (p->nAction <= iVar8) {
        p->nAction = iVar8 + 1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < p->nLookahead);
  }
  if ((makeItSafe != 0) && (iVar8 = p->nterminal + iVar3, p->nAction <= iVar8)) {
    p->nAction = iVar8 + 1;
  }
  p->nLookahead = 0;
  return iVar3 - p->mnLookahead;
}

Assistant:

int acttab_insert(acttab *p, int makeItSafe){
  int i, j, k, n, end;
  assert( p->nLookahead>0 );

  /* Make sure we have enough space to hold the expanded action table
  ** in the worst case.  The worst case occurs if the transaction set
  ** must be appended to the current action table
  */
  n = p->nsymbol + 1;
  if( p->nAction + n >= p->nActionAlloc ){
    int oldAlloc = p->nActionAlloc;
    p->nActionAlloc = p->nAction + n + p->nActionAlloc + 20;
    p->aAction = (struct lookahead_action *) realloc( p->aAction,
                          sizeof(p->aAction[0])*p->nActionAlloc);
    if( p->aAction==0 ){
      fprintf(stderr,"malloc failed\n");
      exit(1);
    }
    for(i=oldAlloc; i<p->nActionAlloc; i++){
      p->aAction[i].lookahead = -1;
      p->aAction[i].action = -1;
    }
  }

  /* Scan the existing action table looking for an offset that is a
  ** duplicate of the current transaction set.  Fall out of the loop
  ** if and when the duplicate is found.
  **
  ** i is the index in p->aAction[] where p->mnLookahead is inserted.
  */
  end = makeItSafe ? p->mnLookahead : 0;
  for(i=p->nAction-1; i>=end; i--){
    if( p->aAction[i].lookahead==p->mnLookahead ){
      /* All lookaheads and actions in the aLookahead[] transaction
      ** must match against the candidate aAction[i] entry. */
      if( p->aAction[i].action!=p->mnAction ) continue;
      for(j=0; j<p->nLookahead; j++){
        k = p->aLookahead[j].lookahead - p->mnLookahead + i;
        if( k<0 || k>=p->nAction ) break;
        if( p->aLookahead[j].lookahead!=p->aAction[k].lookahead ) break;
        if( p->aLookahead[j].action!=p->aAction[k].action ) break;
      }
      if( j<p->nLookahead ) continue;

      /* No possible lookahead value that is not in the aLookahead[]
      ** transaction is allowed to match aAction[i] */
      n = 0;
      for(j=0; j<p->nAction; j++){
        if( p->aAction[j].lookahead<0 ) continue;
        if( p->aAction[j].lookahead==j+p->mnLookahead-i ) n++;
      }
      if( n==p->nLookahead ){
        break;  /* An exact match is found at offset i */
      }
    }
  }

  /* If no existing offsets exactly match the current transaction, find an
  ** an empty offset in the aAction[] table in which we can add the
  ** aLookahead[] transaction.
  */
  if( i<end ){
    /* Look for holes in the aAction[] table that fit the current
    ** aLookahead[] transaction.  Leave i set to the offset of the hole.
    ** If no holes are found, i is left at p->nAction, which means the
    ** transaction will be appended. */
    i = makeItSafe ? p->mnLookahead : 0;
    for(; i<p->nActionAlloc - p->mxLookahead; i++){
      if( p->aAction[i].lookahead<0 ){
        for(j=0; j<p->nLookahead; j++){
          k = p->aLookahead[j].lookahead - p->mnLookahead + i;
          if( k<0 ) break;
          if( p->aAction[k].lookahead>=0 ) break;
        }
        if( j<p->nLookahead ) continue;
        for(j=0; j<p->nAction; j++){
          if( p->aAction[j].lookahead==j+p->mnLookahead-i ) break;
        }
        if( j==p->nAction ){
          break;  /* Fits in empty slots */
        }
      }
    }
  }
  /* Insert transaction set at index i. */
#if 0
  printf("Acttab:");
  for(j=0; j<p->nLookahead; j++){
    printf(" %d", p->aLookahead[j].lookahead);
  }
  printf(" inserted at %d\n", i);
#endif
  for(j=0; j<p->nLookahead; j++){
    k = p->aLookahead[j].lookahead - p->mnLookahead + i;
    p->aAction[k] = p->aLookahead[j];
    if( k>=p->nAction ) p->nAction = k+1;
  }
  if( makeItSafe && i+p->nterminal>=p->nAction ) p->nAction = i+p->nterminal+1;
  p->nLookahead = 0;

  /* Return the offset that is added to the lookahead in order to get the
  ** index into yy_action of the action */
  return i - p->mnLookahead;
}